

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void cmServer::reportProgress(char *msg,float progress,void *data)

{
  allocator local_55;
  float local_54;
  string local_50;
  string local_30;
  
  if (data != (void *)0x0) {
    if ((progress < 0.0) || (1.0 < progress)) {
      std::__cxx11::string::string((string *)&local_50,msg,&local_55);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
      cmServerRequest::ReportMessage((cmServerRequest *)data,&local_50,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_54 = progress;
      std::__cxx11::string::string((string *)&local_50,msg,(allocator *)&local_30);
      cmServerRequest::ReportProgress
                ((cmServerRequest *)data,0,(int)(local_54 * 1000.0),1000,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("request",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x98,"static void cmServer::reportProgress(const char *, float, void *)");
}

Assistant:

void cmServer::reportProgress(const char* msg, float progress, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  if (progress < 0.0f || progress > 1.0f) {
    request->ReportMessage(msg, "");
  } else {
    request->ReportProgress(0, static_cast<int>(progress * 1000), 1000, msg);
  }
}